

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

uint __thiscall o3dgc::Arithmetic_Codec::stop_encoder(Arithmetic_Codec *this)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  bool bVar8;
  
  if (this->mode != 1) {
    AC_Error("invalid to stop encoder");
  }
  this->mode = 0;
  bVar8 = 0x2000000 < this->length;
  uVar6 = 0x8000;
  if (bVar8) {
    uVar6 = 0x800000;
  }
  uVar5 = (uint)bVar8 * 0x800000 + 0x800000;
  puVar1 = &this->base;
  uVar3 = *puVar1;
  *puVar1 = *puVar1 + uVar5;
  this->length = uVar6;
  if (CARRY4(uVar3,uVar5)) {
    puVar7 = this->ac_pointer;
    while( true ) {
      puVar2 = puVar7 + -1;
      puVar7 = puVar7 + -1;
      if (*puVar2 != 0xff) break;
      *puVar7 = '\0';
    }
    *puVar7 = *puVar2 + '\x01';
  }
  do {
    uVar4 = *(uchar *)((long)&this->base + 3);
    puVar7 = this->ac_pointer;
    this->ac_pointer = puVar7 + 1;
    *puVar7 = uVar4;
    this->base = this->base << 8;
    uVar6 = this->length << 8;
    this->length = uVar6;
  } while (uVar6 < 0x1000000);
  uVar6 = *(int *)&this->ac_pointer - *(int *)&this->code_buffer;
  if (uVar6 <= this->buffer_size) {
    return uVar6;
  }
  AC_Error("code buffer overflow");
}

Assistant:

unsigned Arithmetic_Codec::stop_encoder(void)
    {
      if (mode != 1) AC_Error("invalid to stop encoder");
      mode = 0;

      unsigned init_base = base;            // done encoding: set final data bytes

      if (length > 2 * AC__MinLength) {
        base  += AC__MinLength;                                     // base offset
        length = AC__MinLength >> 1;             // set new length for 1 more byte
      }
      else {
        base  += AC__MinLength >> 1;                                // base offset
        length = AC__MinLength >> 9;            // set new length for 2 more bytes
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      renorm_enc_interval();                // renormalization = output last bytes

      unsigned code_bytes = unsigned(ac_pointer - code_buffer);
      if (code_bytes > buffer_size) AC_Error("code buffer overflow");

      return code_bytes;                                   // number of bytes used
    }